

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
IsorecursiveTest_CanonicalizeTypesBeforeSubtyping_Test::TestBody
          (IsorecursiveTest_CanonicalizeTypesBeforeSubtyping_Test *this)

{
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  bool bVar1;
  HeapType other;
  char *message;
  char *in_R9;
  Entry EVar2;
  string local_2c8;
  AssertHelper local_2a8;
  Message local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  Entry local_250;
  Entry local_240;
  allocator<wasm::Field> local_229;
  Entry local_228;
  uintptr_t local_218;
  uintptr_t local_210;
  Field local_208;
  iterator local_1f8;
  size_type local_1f0;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_1e8;
  Struct local_1d0;
  Entry local_1b8;
  allocator<wasm::Field> local_1a1;
  Entry local_1a0;
  uintptr_t local_190;
  uintptr_t local_188;
  Field local_180;
  iterator local_170;
  size_type local_168;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_160;
  Struct local_148;
  Entry local_130;
  uintptr_t local_120;
  Entry local_118;
  Entry local_108;
  Struct local_f8;
  Entry local_d8;
  Struct local_c8;
  Entry local_b0;
  uintptr_t local_a0;
  Entry local_98;
  Entry local_88;
  Struct local_78;
  Entry local_58;
  Struct local_48 [2];
  TypeBuilder local_18;
  TypeBuilder builder;
  IsorecursiveTest_CanonicalizeTypesBeforeSubtyping_Test *this_local;
  
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)this;
  wasm::TypeBuilder::TypeBuilder(&local_18,6);
  wasm::TypeBuilder::createRecGroup((ulong)&local_18,0);
  local_48[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Struct::Struct(local_48);
  local_58 = wasm::TypeBuilder::operator[](&local_18,0);
  wasm::TypeBuilder::Entry::operator=(&local_58,local_48);
  wasm::Struct::~Struct(local_48);
  local_78.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Struct::Struct(&local_78);
  local_88 = wasm::TypeBuilder::operator[](&local_18,1);
  wasm::TypeBuilder::Entry::operator=(&local_88,&local_78);
  wasm::Struct::~Struct(&local_78);
  local_98 = wasm::TypeBuilder::operator[](&local_18,1);
  local_b0 = wasm::TypeBuilder::operator[](&local_18,0);
  local_a0 = (uintptr_t)wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_b0);
  wasm::TypeBuilder::Entry::subTypeOf(&local_98,(HeapType)local_a0);
  wasm::TypeBuilder::createRecGroup((ulong)&local_18,2);
  local_c8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Struct::Struct(&local_c8);
  local_d8 = wasm::TypeBuilder::operator[](&local_18,2);
  wasm::TypeBuilder::Entry::operator=(&local_d8,&local_c8);
  wasm::Struct::~Struct(&local_c8);
  local_f8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Struct::Struct(&local_f8);
  local_108 = wasm::TypeBuilder::operator[](&local_18,3);
  wasm::TypeBuilder::Entry::operator=(&local_108,&local_f8);
  wasm::Struct::~Struct(&local_f8);
  local_118 = wasm::TypeBuilder::operator[](&local_18,3);
  local_130 = wasm::TypeBuilder::operator[](&local_18,2);
  local_120 = (uintptr_t)wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_130);
  wasm::TypeBuilder::Entry::subTypeOf(&local_118,(HeapType)local_120);
  local_1a0 = wasm::TypeBuilder::operator[](&local_18,0);
  local_190 = (uintptr_t)wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_1a0);
  local_188 = wasm::TypeBuilder::getTempRefType((HeapType)&local_18,(Nullability)local_190);
  wasm::Field::Field(&local_180,(Type)local_188,Immutable);
  local_170 = &local_180;
  local_168 = 1;
  std::allocator<wasm::Field>::allocator(&local_1a1);
  __l_00._M_len = local_168;
  __l_00._M_array = local_170;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_160,__l_00,&local_1a1);
  wasm::Struct::Struct(&local_148,&local_160);
  local_1b8 = wasm::TypeBuilder::operator[](&local_18,4);
  wasm::TypeBuilder::Entry::operator=(&local_1b8,&local_148);
  wasm::Struct::~Struct(&local_148);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_160);
  std::allocator<wasm::Field>::~allocator(&local_1a1);
  local_228 = wasm::TypeBuilder::operator[](&local_18,3);
  local_218 = (uintptr_t)wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_228);
  local_210 = wasm::TypeBuilder::getTempRefType((HeapType)&local_18,(Nullability)local_218);
  wasm::Field::Field(&local_208,(Type)local_210,Immutable);
  local_1f8 = &local_208;
  local_1f0 = 1;
  std::allocator<wasm::Field>::allocator(&local_229);
  __l._M_len = local_1f0;
  __l._M_array = local_1f8;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_1e8,__l,&local_229);
  wasm::Struct::Struct(&local_1d0,&local_1e8);
  local_240 = wasm::TypeBuilder::operator[](&local_18,5);
  wasm::TypeBuilder::Entry::operator=(&local_240,&local_1d0);
  wasm::Struct::~Struct(&local_1d0);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_1e8);
  std::allocator<wasm::Field>::~allocator(&local_229);
  local_250 = wasm::TypeBuilder::operator[](&local_18,5);
  EVar2 = wasm::TypeBuilder::operator[](&local_18,4);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar2.builder;
  other = wasm::TypeBuilder::Entry::operator_cast_to_HeapType
                    ((Entry *)((long)&result.
                                      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                      .
                                      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                      .
                                      super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                      .
                                      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                      .
                                      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                      .
                                      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              + 0x18));
  wasm::TypeBuilder::Entry::subTypeOf(&local_250,other);
  wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_298,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c8,(internal *)local_298,(AssertionResult *)"result","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x1fe,message);
    testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  wasm::TypeBuilder::~TypeBuilder(&local_18);
  return;
}

Assistant:

TEST_F(IsorecursiveTest, CanonicalizeTypesBeforeSubtyping) {
  TypeBuilder builder(6);
  // A rec group
  builder.createRecGroup(0, 2);
  builder[0] = Struct{};
  builder[1] = Struct{};
  builder[1].subTypeOf(builder[0]);

  // The same rec group again
  builder.createRecGroup(2, 2);
  builder[2] = Struct{};
  builder[3] = Struct{};
  builder[3].subTypeOf(builder[2]);

  // This subtyping only validates if the previous two groups are deduplicated
  // before checking subtype validity.
  builder[4] =
    Struct({Field(builder.getTempRefType(builder[0], Nullable), Immutable)});
  builder[5] =
    Struct({Field(builder.getTempRefType(builder[3], Nullable), Immutable)});
  builder[5].subTypeOf(builder[4]);

  auto result = builder.build();
  EXPECT_TRUE(result);
}